

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_9::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  int iVar1;
  iovec *__iovec;
  long lVar2;
  iovec *piVar3;
  ulong uVar4;
  size_t count;
  Fault f_2;
  ssize_t n;
  Array<iovec> iov_heap;
  Fault f_1;
  iovec iov_stack [16];
  
  do {
    iVar1 = fallocate64((this->fd).fd,3,offset,size);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    if (iVar1 == 0x5f) {
      uVar4 = size + 0xfff >> 0xc;
      count = 0x400;
      if (uVar4 < 0x400) {
        count = uVar4;
      }
      if (size + 0xfff < 0x11000) {
        iov_heap.ptr = (iovec *)0x0;
        iov_heap.size_ = 0;
        iov_heap.disposer = (ArrayDisposer *)0x0;
        __iovec = iov_stack;
      }
      else {
        __iovec = kj::_::HeapArrayDisposer::allocate<iovec>(count);
        iov_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        iov_heap.ptr = __iovec;
        iov_heap.size_ = count;
      }
      piVar3 = (iovec *)__iovec;
      for (lVar2 = count << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
        piVar3->iov_base = "";
        piVar3->iov_len = 0x1000;
        piVar3 = piVar3 + 1;
      }
      for (; size != 0; size = size - n) {
        if ((size < count << 0xc) && ((size & 0xfff) != 0)) {
          *(uint64_t *)((long)&((iovec *)__iovec)->iov_len + (size >> 8 & 0xfffffffffffffff0)) =
               size & 0xfff;
        }
        do {
          n = pwritev64((this->fd).fd,(iovec *)__iovec,(int)uVar4,offset);
          if (-1 < n) goto LAB_0041b161;
          iVar1 = kj::_::Debug::getOsErrorNumber(false);
        } while (iVar1 == -1);
        if (iVar1 != 0) {
          kj::_::Debug::Fault::Fault
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1c2,iVar1,"n = pwritev(fd, iov.begin(), count, offset)","");
          kj::_::Debug::Fault::fatal(&f_1);
        }
LAB_0041b161:
        f_1.exception = (Exception *)&n;
        if (n < 1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1c3,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",
                     (DebugComparison<long_&,_int> *)&f_1,(char (*) [24])"pwrite() returned zero?");
          kj::_::Debug::Fault::fatal(&f_2);
        }
        offset = offset + n;
      }
      Array<iovec>::~Array(&iov_heap);
    }
    else {
      kj::_::Debug::Fault::Fault
                ((Fault *)iov_stack,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x19a,iVar1,"fallocate(FALLOC_FL_PUNCH_HOLE)","");
      kj::_::Debug::Fault::~Fault((Fault *)iov_stack);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
    // If FALLOC_FL_PUNCH_HOLE is defined, use it to efficiently zero the area.
    //
    // A fallocate() wrapper was only added to Android's Bionic C library as of API level 21,
    // but FALLOC_FL_PUNCH_HOLE is apparently defined in the headers before that, so we'll
    // have to explicitly test for that case.
#if defined(FALLOC_FL_PUNCH_HOLE) && !(__ANDROID__ && __BIONIC__ && __ANDROID_API__ < 21)
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax();
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }